

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O0

void fmt::v11::vprint(FILE *f,text_style *ts,string_view fmt,format_args args)

{
  char *s;
  size_t count;
  value<fmt::v11::context> *this;
  basic_string_view<char> bVar1;
  memory_buffer buf;
  vargs<fmt::v11::basic_string_view<char>_> va;
  int unused;
  string_view sv;
  allocator<char> *in_stack_fffffffffffffc78;
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *in_stack_fffffffffffffc80;
  buffer<char> *this_00;
  anon_class_1_0_00000001 *in_stack_fffffffffffffc90;
  basic_string_view<char> *this_01;
  basic_string_view<char> *x;
  basic_string_view<char> local_340;
  undefined1 local_329;
  basic_string_view<char> local_328 [4];
  FILE *in_stack_fffffffffffffd20;
  format_args in_stack_fffffffffffffd28;
  string_view in_stack_fffffffffffffd38;
  text_style *in_stack_fffffffffffffd48;
  buffer<char> *in_stack_fffffffffffffd50;
  basic_format_args<fmt::v11::context> in_stack_fffffffffffffd58;
  basic_string_view<char> in_stack_fffffffffffffd68;
  undefined8 local_98;
  undefined1 *local_90;
  char *local_88;
  size_t sStack_80;
  undefined1 local_78 [24];
  basic_string_view<char> *local_60;
  char *local_50;
  size_t sStack_48;
  undefined1 *local_40;
  undefined8 *local_38;
  int local_2c;
  char *local_28;
  undefined8 local_20;
  undefined1 *local_10;
  basic_string_view<char> *local_8;
  
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::basic_memory_buffer
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  detail::vformat_to<char>
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd68,
             in_stack_fffffffffffffd58);
  vprint::anon_class_1_0_00000001::operator()(in_stack_fffffffffffffc90);
  x = local_328;
  local_10 = &local_329;
  local_8 = x;
  bVar1 = operator()((FMT_COMPILE_STRING *)0xebb3f2);
  this = (value<fmt::v11::context> *)bVar1.size_;
  *x = bVar1;
  local_28 = "{}";
  local_20 = 2;
  local_2c = 0;
  detail::ignore_unused<int>(&local_2c);
  this_00 = (buffer<char> *)&stack0xfffffffffffffd20;
  s = detail::buffer<char>::begin(this_00);
  count = detail::buffer<char>::size(this_00);
  this_01 = &local_340;
  basic_string_view<char>::basic_string_view(this_01,s,count);
  local_50 = local_328[0].data_;
  sStack_48 = local_328[0].size_;
  local_60 = this_01;
  detail::value<fmt::v11::context>::value<fmt::v11::basic_string_view<char>,_char,_0>(this,x);
  local_88 = local_50;
  sStack_80 = sStack_48;
  local_38 = &local_98;
  local_40 = local_78;
  local_98 = 0xd;
  local_90 = local_40;
  vprint(in_stack_fffffffffffffd20,in_stack_fffffffffffffd38,in_stack_fffffffffffffd28);
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *)0xebb556);
  return;
}

Assistant:

inline void vprint(FILE* f, const text_style& ts, string_view fmt,
                   format_args args) {
  auto buf = memory_buffer();
  detail::vformat_to(buf, ts, fmt, args);
  print(f, FMT_STRING("{}"), string_view(buf.begin(), buf.size()));
}